

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O2

_outconnect *
obj_nexttraverseoutlet(_outconnect *lastconnect,t_object **destp,_inlet **inletp,int *whichp)

{
  t_object *ptVar1;
  _class *p_Var2;
  t_object *ptVar3;
  t_object *ptVar4;
  _inlet *i;
  int iVar5;
  _inlet **pp_Var6;
  
  ptVar1 = (t_object *)lastconnect->oc_to;
  p_Var2 = (ptVar1->te_g).g_pd;
  if ((((p_Var2 == inlet_class) || (p_Var2 == pointerinlet_class)) || (p_Var2 == floatinlet_class))
     || (p_Var2 == symbolinlet_class)) {
    ptVar3 = (t_object *)ptVar1->te_binbuf;
    iVar5 = (int)((ptVar3->te_g).g_pd)->c_firstin;
    pp_Var6 = &ptVar3->te_inlet;
    while ((ptVar4 = (t_object *)*pp_Var6, ptVar4 != (t_object *)0x0 && (ptVar4 != ptVar1))) {
      iVar5 = iVar5 + 1;
      pp_Var6 = (_inlet **)&(ptVar4->te_g).g_next;
    }
    *whichp = iVar5;
    *destp = ptVar3;
    destp = (t_object **)inletp;
  }
  else {
    *whichp = 0;
    *inletp = (_inlet *)0x0;
  }
  *destp = ptVar1;
  return lastconnect->oc_next;
}

Assistant:

t_outconnect *obj_nexttraverseoutlet(t_outconnect *lastconnect,
    t_object **destp, t_inlet **inletp, int *whichp)
{
    t_pd *y;
    y = lastconnect->oc_to;
    if (ISINLET(y))
    {
        int n;
        t_inlet *i = (t_inlet *)y, *i2;
        t_object *dest = i->i_owner;
        for (n = dest->ob_pd->c_firstin, i2 = dest->ob_inlet;
            i2 && i2 != i; i2 = i2->i_next) n++;
        *whichp = n;
        *destp = dest;
        *inletp = i;
    }
    else
    {
        *whichp = 0;
        *inletp = 0;
        *destp = ((t_object *)y);
    }
    return (lastconnect->oc_next);
}